

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O1

int Disto16x16_C(uint8_t *a,uint8_t *b,uint16_t *w)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  
  iVar6 = 0;
  uVar4 = 0;
  do {
    uVar7 = 0;
    do {
      iVar1 = TTransform(a + uVar7,w);
      iVar2 = TTransform(b + uVar7,w);
      uVar3 = iVar2 - iVar1;
      uVar5 = -uVar3;
      if (0 < (int)uVar3) {
        uVar5 = uVar3;
      }
      iVar6 = iVar6 + (uVar5 >> 5);
      bVar8 = uVar7 < 0xc;
      uVar7 = uVar7 + 4;
    } while (bVar8);
    a = a + 0x80;
    b = b + 0x80;
    bVar8 = uVar4 < 0x180;
    uVar4 = uVar4 + 0x80;
  } while (bVar8);
  return iVar6;
}

Assistant:

static int Disto16x16_C(const uint8_t* WEBP_RESTRICT const a,
                        const uint8_t* WEBP_RESTRICT const b,
                        const uint16_t* WEBP_RESTRICT const w) {
  int D = 0;
  int x, y;
  for (y = 0; y < 16 * BPS; y += 4 * BPS) {
    for (x = 0; x < 16; x += 4) {
      D += Disto4x4_C(a + x + y, b + x + y, w);
    }
  }
  return D;
}